

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makecrct.c
# Opt level: O0

void write_table(uint32_t *table,int k)

{
  char *pcVar1;
  int in_ESI;
  long in_RDI;
  int n;
  char *local_28;
  int local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    pcVar1 = "    ";
    if (local_10 == 0 || local_10 % 5 != 0) {
      pcVar1 = "";
    }
    if (local_10 == in_ESI + -1) {
      local_28 = "";
    }
    else {
      local_28 = ", ";
      if (local_10 % 5 == 4) {
        local_28 = ",\n";
      }
    }
    printf("%s0x%08x%s",pcVar1,(ulong)*(uint *)(in_RDI + (long)local_10 * 4),local_28);
  }
  return;
}

Assistant:

static void write_table(const uint32_t *table, int k) {
    int n;

    for (n = 0; n < k; n++)
        printf("%s0x%08" PRIx32 "%s", n == 0 || n % 5 ? "" : "    ",
                (uint32_t)(table[n]),
                n == k - 1 ? "" : (n % 5 == 4 ? ",\n" : ", "));
}